

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

void BinaryCache::RemoveImportPath(char *path)

{
  char *pcVar1;
  undefined *puVar2;
  uint uVar3;
  int iVar4;
  char **ppcVar5;
  uint local_14;
  uint i;
  char *path_local;
  
  local_14 = 0;
  while( true ) {
    uVar3 = FastVector<char_*,_false,_false>::size((FastVector<char_*,_false,_false> *)importPaths);
    if (uVar3 <= local_14) {
      return;
    }
    ppcVar5 = FastVector<char_*,_false,_false>::operator[]
                        ((FastVector<char_*,_false,_false> *)importPaths,local_14);
    iVar4 = strcmp(*ppcVar5,path);
    puVar2 = NULLC::dealloc;
    if (iVar4 == 0) break;
    local_14 = local_14 + 1;
  }
  ppcVar5 = FastVector<char_*,_false,_false>::operator[]
                      ((FastVector<char_*,_false,_false> *)importPaths,local_14);
  (*(code *)puVar2)(*ppcVar5);
  ppcVar5 = FastVector<char_*,_false,_false>::back((FastVector<char_*,_false,_false> *)importPaths);
  pcVar1 = *ppcVar5;
  ppcVar5 = FastVector<char_*,_false,_false>::operator[]
                      ((FastVector<char_*,_false,_false> *)importPaths,local_14);
  *ppcVar5 = pcVar1;
  FastVector<char_*,_false,_false>::pop_back((FastVector<char_*,_false,_false> *)importPaths);
  return;
}

Assistant:

void BinaryCache::RemoveImportPath(const char* path)
{
	for(unsigned int i = 0; i < importPaths.size(); i++)
	{
		if(strcmp(importPaths[i], path) == 0)
		{
			NULLC::dealloc(importPaths[i]);

			importPaths[i] = importPaths.back();
			importPaths.pop_back();
			return;
		}
	}
}